

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::ScalarReplacementPass::TransferAnnotations
          (ScalarReplacementPass *this,Instruction *source,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  IRContext *pIVar1;
  DecorationManager *this_00;
  Instruction *this_01;
  Instruction *this_02;
  ScalarReplacementPass *pSVar2;
  uint32_t uVar3;
  array<signed_char,_4UL> aVar4;
  array<signed_char,_4UL> aVar5;
  pointer ppIVar6;
  Instruction *this_03;
  pointer pOVar7;
  Operand *pOVar8;
  uint uVar9;
  SmallVector<unsigned_int,_2UL> *this_04;
  pointer *__ptr;
  long lVar10;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_05;
  Operand *__cur;
  Operand copy;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range4;
  undefined1 local_148 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_120;
  undefined4 local_118;
  undefined1 local_110 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_f0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_e8;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_d0;
  pointer local_c8;
  pointer local_c0;
  ScalarReplacementPass *local_b8;
  pointer local_b0;
  IRContext *local_a8;
  pointer local_a0;
  undefined1 local_98 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_78;
  undefined1 local_70 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  local_d0 = replacements;
  if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(pIVar1);
  }
  this_00 = (pIVar1->decoration_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl
  ;
  uVar3 = 0;
  if (source->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(source,(uint)source->has_type_id_);
  }
  analysis::DecorationManager::GetDecorationsFor(&local_48,this_00,uVar3,false);
  local_c8 = local_48.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppIVar6 = local_48.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = this;
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_b8 = pSVar2;
      this_01 = *ppIVar6;
      local_c0 = ppIVar6;
      if (this_01->opcode_ != OpDecorate) {
        __assert_fail("inst->opcode() == spv::Op::OpDecorate",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                      ,0x1bd,
                      "void spvtools::opt::ScalarReplacementPass::TransferAnnotations(const Instruction *, std::vector<Instruction *> *)"
                     );
      }
      uVar9 = (this_01->has_result_id_ & 1) + 1;
      if (this_01->has_type_id_ == false) {
        uVar9 = (uint)this_01->has_result_id_;
      }
      aVar4._M_elems = (_Type)Instruction::GetSingleWordOperand(this_01,uVar9 + 1);
      if (((uint)aVar4._M_elems & 0xfffffffe) == 0x12) {
        ppIVar6 = (local_d0->
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_b0 = (local_d0->
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        if (ppIVar6 != local_b0) {
          do {
            this_02 = *ppIVar6;
            if (this_02 != (Instruction *)0x0) {
              local_a0 = ppIVar6;
              this_03 = (Instruction *)operator_new(0x70);
              local_a8 = (this->super_MemPass).super_Pass.context_;
              aVar5._M_elems[0] = '\0';
              aVar5._M_elems[1] = '\0';
              aVar5._M_elems[2] = '\0';
              aVar5._M_elems[3] = '\0';
              if (this_02->has_result_id_ == true) {
                aVar5._M_elems =
                     (_Type)Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
              }
              local_70._0_8_ = &PTR__SmallVector_009488e0;
              local_70._24_8_ = local_70 + 0x10;
              local_50._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
              local_70._8_8_ = 1;
              local_148._0_4_ = SPV_OPERAND_TYPE_ID;
              local_148._8_8_ = &PTR__SmallVector_009488e0;
              local_148._16_8_ = 0;
              local_148._32_8_ = local_148 + 0x18;
              local_120._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
              this_04 = (SmallVector<unsigned_int,_2UL> *)(local_148 + 8);
              local_70._16_4_ = aVar5._M_elems;
              utils::SmallVector<unsigned_int,_2UL>::operator=
                        (this_04,(SmallVector<unsigned_int,_2UL> *)local_70);
              local_98._0_8_ = &PTR__SmallVector_009488e0;
              local_98._24_8_ = local_98 + 0x10;
              local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
              local_98._8_8_ = 1;
              local_118 = 0x1c;
              local_110._0_8_ = &PTR__SmallVector_009488e0;
              local_110._8_8_ = 0;
              local_110._24_8_ = local_110 + 0x10;
              local_f0._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
              local_98._16_4_ = aVar4._M_elems;
              utils::SmallVector<unsigned_int,_2UL>::operator=
                        ((SmallVector<unsigned_int,_2UL> *)local_110,
                         (SmallVector<unsigned_int,_2UL> *)local_98);
              local_e8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar10 = 0x60;
              pOVar7 = (pointer)operator_new(0x60);
              local_e8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start = pOVar7;
              local_e8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar7 + 2;
              do {
                pOVar7->type = *(spv_operand_type_t *)
                                &this_04[-1].large_data_._M_t.
                                 super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                 ._M_head_impl;
                (pOVar7->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_009488e0;
                (pOVar7->words).size_ = 0;
                (pOVar7->words).small_data_ = (uint *)(pOVar7->words).buffer;
                (pOVar7->words).large_data_._M_t.
                super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
                utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar7->words,this_04);
                pOVar7 = pOVar7 + 1;
                this_04 = (SmallVector<unsigned_int,_2UL> *)&this_04[1].size_;
                lVar10 = lVar10 + -0x30;
              } while (lVar10 != 0);
              local_e8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_finish = pOVar7;
              Instruction::Instruction(this_03,local_a8,OpDecorate,0,0,&local_e8);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                        (&local_e8);
              this = local_b8;
              lVar10 = -0x60;
              this_05 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *
                        )&local_f0;
              do {
                *(undefined ***)(this_05 + -0x20) = &PTR__SmallVector_009488e0;
                if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_05 !=
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                  std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                  operator()(this_05,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                                      this_05);
                }
                *(undefined8 *)this_05 = 0;
                this_05 = this_05 + -0x30;
                lVar10 = lVar10 + 0x30;
              } while (lVar10 != 0);
              local_98._0_8_ = &PTR__SmallVector_009488e0;
              if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )local_78._M_head_impl !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&local_78,local_78._M_head_impl);
              }
              local_70._0_8_ = &PTR__SmallVector_009488e0;
              if (local_50._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                  ._M_head_impl !=
                  (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )0x0) {
                std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&local_50,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           local_50._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl);
              }
              uVar9 = (this_01->has_result_id_ & 1) + 1;
              if (this_01->has_type_id_ == false) {
                uVar9 = (uint)this_01->has_result_id_;
              }
              if (2 < (int)((ulong)((long)(this_01->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this_01->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555 - uVar9) {
                uVar3 = 2;
                do {
                  pOVar8 = Instruction::GetInOperand(this_01,uVar3);
                  local_148._0_4_ = pOVar8->type;
                  local_148._8_8_ = &PTR__SmallVector_009488e0;
                  local_148._16_8_ = 0;
                  local_148._32_8_ = local_148 + 0x18;
                  local_120._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                  ._M_head_impl =
                       (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
                  utils::SmallVector<unsigned_int,_2UL>::operator=
                            ((SmallVector<unsigned_int,_2UL> *)(local_148 + 8),&pOVar8->words);
                  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                  emplace_back<spvtools::opt::Operand>(&this_03->operands_,(Operand *)local_148);
                  local_148._8_8_ = &PTR__SmallVector_009488e0;
                  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )local_120._M_t.
                        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        .
                        super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                        ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
                  {
                    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                    operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&local_120,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               local_120._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl);
                  }
                  uVar3 = uVar3 + 1;
                  uVar9 = (this_01->has_result_id_ & 1) + 1;
                  if (this_01->has_type_id_ == false) {
                    uVar9 = (uint)this_01->has_result_id_;
                  }
                } while (uVar3 < (int)((ulong)((long)(this_01->operands_).
                                                                                                          
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this_01->operands_).
                                                                                                        
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                 -0x55555555 - uVar9);
              }
              pIVar1 = (this->super_MemPass).super_Pass.context_;
              if ((pIVar1->valid_analyses_ & kAnalysisDecorations) != kAnalysisNone) {
                analysis::DecorationManager::AddDecoration
                          ((pIVar1->decoration_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                           .
                           super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>
                           ._M_head_impl,this_03);
              }
              if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
                analysis::DefUseManager::AnalyzeInstDefUse
                          ((pIVar1->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl,this_03);
              }
              utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                        (&(((pIVar1->module_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                          annotations_).super_IntrusiveList<spvtools::opt::Instruction>,this_03);
              pIVar1 = (this->super_MemPass).super_Pass.context_;
              if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                IRContext::BuildDefUseManager(pIVar1);
              }
              analysis::DefUseManager::AnalyzeInstUse
                        ((pIVar1->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,
                         *(Instruction **)
                          ((long)&(((((this->super_MemPass).super_Pass.context_)->module_)._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>.
                                   _M_head_impl)->annotations_).
                                  super_IntrusiveList<spvtools::opt::Instruction> + 0x18));
              ppIVar6 = local_a0;
            }
            ppIVar6 = ppIVar6 + 1;
          } while (ppIVar6 != local_b0);
        }
      }
      ppIVar6 = local_c0 + 1;
      pSVar2 = local_b8;
    } while (local_c0 + 1 != local_c8);
  }
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ScalarReplacementPass::TransferAnnotations(
    const Instruction* source, std::vector<Instruction*>* replacements) {
  // Only transfer invariant and restrict decorations on the variable. There are
  // no type or member decorations that are necessary to transfer.
  for (auto inst :
       get_decoration_mgr()->GetDecorationsFor(source->result_id(), false)) {
    assert(inst->opcode() == spv::Op::OpDecorate);
    auto decoration = spv::Decoration(inst->GetSingleWordInOperand(1u));
    if (decoration == spv::Decoration::Invariant ||
        decoration == spv::Decoration::Restrict) {
      for (auto var : *replacements) {
        if (var == nullptr) {
          continue;
        }

        std::unique_ptr<Instruction> annotation(new Instruction(
            context(), spv::Op::OpDecorate, 0, 0,
            std::initializer_list<Operand>{
                {SPV_OPERAND_TYPE_ID, {var->result_id()}},
                {SPV_OPERAND_TYPE_DECORATION, {uint32_t(decoration)}}}));
        for (uint32_t i = 2; i < inst->NumInOperands(); ++i) {
          Operand copy(inst->GetInOperand(i));
          annotation->AddOperand(std::move(copy));
        }
        context()->AddAnnotationInst(std::move(annotation));
        get_def_use_mgr()->AnalyzeInstUse(&*--context()->annotation_end());
      }
    }
  }
}